

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O0

_Bool test_mul(void)

{
  int iVar1;
  uint8_t auStackY_268 [8];
  m256v *out;
  m256v *in_stack_fffffffffffffda8;
  m256v *A_00;
  uint8_t auStack_248 [8];
  m256v *AB_out;
  m256v *in_stack_fffffffffffffdc8;
  m256v *AB_out_00;
  m256v *in_stack_fffffffffffffdd8;
  m256v *in_stack_fffffffffffffde0;
  m256v *in_stack_fffffffffffffde8;
  m256v *in_stack_fffffffffffffdf0;
  uint8_t auStack_1f8 [3];
  uint8_t in_stack_fffffffffffffe0b;
  int in_stack_fffffffffffffe0c;
  uint8_t *in_stack_fffffffffffffe10;
  uint8_t auStack_1d8 [3];
  uint8_t in_stack_fffffffffffffe2b;
  int in_stack_fffffffffffffe2c;
  uint8_t *in_stack_fffffffffffffe30;
  uint8_t auStack_1a8 [3];
  uint8_t in_stack_fffffffffffffe5b;
  int in_stack_fffffffffffffe5c;
  uint8_t *in_stack_fffffffffffffe60;
  undefined1 local_e8 [8];
  m256v R2;
  m256v BC;
  m256v AC;
  m256v R1;
  m256v ApB;
  m256v C;
  m256v B;
  m256v A;
  int dim3;
  int dim2;
  int dim1;
  int i;
  
  dim2 = 0;
  while( true ) {
    if (999 < dim2) {
      return true;
    }
    rand_coeffs(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe5b);
    m256v_make((m256v *)&B.e,5,7,auStack_1a8);
    rand_coeffs(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe2b);
    m256v_make((m256v *)&C.e,5,7,auStack_1d8);
    rand_coeffs(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe0b);
    m256v_make((m256v *)&ApB.e,7,3,auStack_1f8);
    m256v_make((m256v *)&R1.e,5,7,&stack0xfffffffffffffdd8);
    AB_out_00 = (m256v *)0x102b72;
    m256v_add(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    m256v_make((m256v *)&AC.e,5,3,&stack0xfffffffffffffdc8);
    AB_out = (m256v *)0x102bbc;
    m256v_mul(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    m256v_make((m256v *)&BC.e,5,3,auStack_248);
    A_00 = (m256v *)0x102bff;
    m256v_mul(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,AB_out_00);
    m256v_make((m256v *)&R2.e,5,3,&stack0xfffffffffffffda8);
    out = (m256v *)0x102c42;
    m256v_mul(AB_out_00,in_stack_fffffffffffffdc8,AB_out);
    m256v_make((m256v *)local_e8,5,3,auStackY_268);
    m256v_add(A_00,in_stack_fffffffffffffda8,out);
    iVar1 = memcmp(&stack0xfffffffffffffdc8,auStackY_268,0xf);
    if (iVar1 != 0) break;
    dim2 = dim2 + 1;
  }
  fprintf(_stderr,"%s:%d:  Multiplication is not distributive.\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
          ,0x188);
  return false;
}

Assistant:

static bool test_mul()
{
	/* Random checks:  Verify distributivity */

	/* We verify the identity (A + B)*C = A*C + B*C */
	for (int i = 0; i < 1000; ++i) {
		const int dim1 = 5, dim2 = 7, dim3 = 3;

		/* Create matrices */
		Def_mat256_rand(A, a, dim1, dim2, 0xff)
		Def_mat256_rand(B, b, dim1, dim2, 0xff)
		Def_mat256_rand(C, c, dim2, dim3, 0xff)

		/* Compute R1 := (A + B)*C */
		m256v_Def(ApB, apb, dim1, dim2)
		m256v_add(&A, &B, &ApB);
		m256v_Def(R1, r1, dim1, dim3)
		m256v_mul(&ApB, &C, &R1);

		/* Compute R2 := A*C + B*C */
		m256v_Def(AC, ac, dim1, dim3)
		m256v_mul(&A, &C, &AC);
		m256v_Def(BC, bc, dim1, dim3)
		m256v_mul(&B, &C, &BC);
		m256v_Def(R2, r2, dim1, dim3)
		m256v_add(&AC, &BC, &R2);

		/* Make sure R1 = R2 */
		if (memcmp(r1, r2, sizeof(r2)) != 0) {
			fprintf(stderr,
			  "%s:%d:  Multiplication is not distributive.\n",
			  __FILE__, __LINE__);
			return false;
		}
	}

	return true;
}